

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGet.h
# Opt level: O0

double __thiscall
TGet_TransitionModelMappingSparse::Get
          (TGet_TransitionModelMappingSparse *this,Index sI,Index jaI,Index sucSI)

{
  const_reference pvVar1;
  uint in_EDX;
  long in_RDI;
  size_type in_stack_ffffffffffffff98;
  sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffffa0;
  value_type vVar2;
  
  std::
  vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::operator[]((vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                *)(in_RDI + 8),(ulong)in_EDX);
  boost::numeric::ublas::
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::operator()((compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)&stack0xffffffffffffffc8,(size_type)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
  pvVar1 = boost::numeric::ublas::sparse_matrix_element::operator_cast_to_double_
                     (in_stack_ffffffffffffffa0);
  vVar2 = *pvVar1;
  boost::numeric::ublas::
  sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::~sparse_matrix_element
            ((sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              *)0xab0261);
  return vVar2;
}

Assistant:

virtual double Get(Index sI, Index jaI, Index sucSI) const
    {  { return((*_m_T[jaI])(sI,sucSI)); } }